

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsInitializeModuleRecord
          (JsModuleRecord referencingModule,JsValueRef normalizedSpecifier,
          JsModuleRecord *moduleRecord)

{
  anon_class_16_2_4e5ac7f3 fn;
  SourceTextModuleRecord *pSStack_30;
  JsErrorCode errorCode;
  SourceTextModuleRecord *newModuleRecord;
  JsModuleRecord *moduleRecord_local;
  JsValueRef normalizedSpecifier_local;
  JsModuleRecord referencingModule_local;
  
  if (moduleRecord == (JsModuleRecord *)0x0) {
    referencingModule_local._4_4_ = JsErrorNullArgument;
  }
  else {
    pSStack_30 = (SourceTextModuleRecord *)0x0;
    fn.normalizedSpecifier = &moduleRecord_local;
    fn.newModuleRecord = &stack0xffffffffffffffd0;
    newModuleRecord = (SourceTextModuleRecord *)moduleRecord;
    moduleRecord_local = (JsModuleRecord *)normalizedSpecifier;
    normalizedSpecifier_local = referencingModule;
    referencingModule_local._4_4_ =
         ContextAPIWrapper_NoRecord<true,JsInitializeModuleRecord::__0>(fn);
    if (referencingModule_local._4_4_ == JsNoError) {
      (newModuleRecord->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject
      ._vptr_IRecyclerVisitedObject = (_func_int **)pSStack_30;
    }
    else {
      (newModuleRecord->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject
      ._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
    }
  }
  return referencingModule_local._4_4_;
}

Assistant:

CHAKRA_API
JsInitializeModuleRecord(
    _In_opt_ JsModuleRecord referencingModule,
    _In_opt_ JsValueRef normalizedSpecifier,
    _Outptr_result_maybenull_ JsModuleRecord* moduleRecord)
{
    PARAM_NOT_NULL(moduleRecord);

    Js::SourceTextModuleRecord* newModuleRecord = nullptr;

    JsErrorCode errorCode = ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        newModuleRecord = Js::SourceTextModuleRecord::Create(scriptContext);
        newModuleRecord->SetSpecifier(normalizedSpecifier);
        return JsNoError;
    });
    if (errorCode == JsNoError)
    {
        *moduleRecord = newModuleRecord;
    }
    else
    {
        *moduleRecord = JS_INVALID_REFERENCE;
    }
    return errorCode;
}